

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PrimQuadUV
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImVec2 *uv_a,ImVec2 *uv_b,
          ImVec2 *uv_c,ImVec2 *uv_d,ImU32 col)

{
  ImDrawIdx IVar1;
  
  IVar1 = (ImDrawIdx)this->_VtxCurrentIdx;
  *this->_IdxWritePtr = IVar1;
  this->_IdxWritePtr[1] = IVar1 + 1;
  this->_IdxWritePtr[2] = IVar1 + 2;
  this->_IdxWritePtr[3] = IVar1;
  this->_IdxWritePtr[4] = IVar1 + 2;
  this->_IdxWritePtr[5] = IVar1 + 3;
  this->_VtxWritePtr->pos = *a;
  this->_VtxWritePtr->uv = *uv_a;
  this->_VtxWritePtr->col = col;
  this->_VtxWritePtr[1].pos = *b;
  this->_VtxWritePtr[1].uv = *uv_b;
  this->_VtxWritePtr[1].col = col;
  this->_VtxWritePtr[2].pos = *c;
  this->_VtxWritePtr[2].uv = *uv_c;
  this->_VtxWritePtr[2].col = col;
  this->_VtxWritePtr[3].pos = *d;
  this->_VtxWritePtr[3].uv = *uv_d;
  this->_VtxWritePtr[3].col = col;
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
  this->_VtxWritePtr = this->_VtxWritePtr + 4;
  this->_IdxWritePtr = this->_IdxWritePtr + 6;
  return;
}

Assistant:

void ImDrawList::PrimQuadUV(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, const ImVec2& uv_a, const ImVec2& uv_b, const ImVec2& uv_c, const ImVec2& uv_d, ImU32 col)
{
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv_a; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv_b; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv_c; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv_d; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}